

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::PopFuncInfo(ByteCodeGenerator *this,char16 *location)

{
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  Type pFVar2;
  bool bVar3;
  Type *ppFVar4;
  
  pSVar1 = this->funcInfoStack;
  ppFVar4 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&pSVar1->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar2 = *ppFVar4;
  SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&pSVar1->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>,
             pSVar1->allocator);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ByteCodePhase);
  if (bVar3) {
    Output::Print(L"%s: PopFuncInfo: %s",location,pFVar2->name);
    pSVar1 = this->funcInfoStack;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (pSVar1->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1) {
      ppFVar4 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&pSVar1->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      if (*ppFVar4 != (Type)0x0) {
        ppFVar4 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                            (&this->funcInfoStack->
                              super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        Output::Print(L" Top: %s",(*ppFVar4)->name);
      }
    }
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void ByteCodeGenerator::PopFuncInfo(char16 const * location)
{
    FuncInfo * funcInfo = funcInfoStack->Pop();
    // Assert(!funcInfo->IsGlobalFunction() || this->TopFuncInfo() == nullptr || this->TopFuncInfo()->IsGlobalFunction());
    if (PHASE_TRACE1(Js::ByteCodePhase))
    {
        Output::Print(_u("%s: PopFuncInfo: %s"), location, funcInfo->name);
        if (this->TopFuncInfo())
        {
            Output::Print(_u(" Top: %s"), this->TopFuncInfo()->name);
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }
}